

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int vm_builtin_is_callable(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iBool;
  
  if (nArg < 1) {
    iBool = 0;
  }
  else {
    iBool = jx9VmIsCallable(pCtx->pVm,*apArg);
  }
  jx9_result_bool(pCtx,iBool);
  return 0;
}

Assistant:

static int vm_builtin_is_callable(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_vm *pVm;	
	int res;
	if( nArg < 1 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return SXRET_OK;
	}
	/* Point to the target VM */
	pVm = pCtx->pVm;
	/* Perform the requested operation */
	res = jx9VmIsCallable(pVm, apArg[0]);
	jx9_result_bool(pCtx, res);
	return SXRET_OK;
}